

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.cpp
# Opt level: O1

int __thiscall QUEUE::operator[](QUEUE *this,int x)

{
  STACK *this_00;
  int iVar1;
  out_of_range *this_01;
  int iVar2;
  
  if ((-1 < x) && (iVar1 = (*(this->super_STACK)._vptr_STACK[1])(), x < iVar1)) {
    this_00 = &this->s2;
    iVar1 = STACK::operator_cast_to_int(this_00);
    iVar2 = x - iVar1;
    if (x < iVar1) {
      iVar2 = STACK::operator_cast_to_int(this_00);
      iVar2 = ~x + iVar2;
      this = (QUEUE *)this_00;
    }
    iVar1 = STACK::operator[](&this->super_STACK,iVar2);
    return iVar1;
  }
  this_01 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_01,"[ERROR] Index out of range!");
  __cxa_throw(this_01,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

int QUEUE::operator[](int x) const {
  if (x < 0 || x >= int(*this))
    throw std::out_of_range("[ERROR] Index out of range!");
  int output_len = int(s2);
  // If x in the output stack
	if (x < output_len)
    return s2[int(s2) - 1 - x];
  // X in the input stack
  else
    return this->STACK::operator[](x - output_len);
}